

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O0

double raplcap_pd_get_energy_counter(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  raplcap_msr *ctx;
  off_t msr_00;
  double dVar2;
  off_t msr;
  raplcap_msr *state;
  uint64_t msrval;
  uint32_t local_20;
  raplcap_zone zone_local;
  uint32_t die_local;
  uint32_t pkg_local;
  raplcap *rc_local;
  
  msrval._4_4_ = zone;
  local_20 = die;
  zone_local = pkg;
  _die_local = rc;
  ctx = get_state(rc,pkg,die);
  msr_00 = zone_to_msr_offset(msrval._4_4_,ZONE_OFFSETS_ENERGY);
  if (((ctx != (raplcap_msr *)0x0) && (-1 < msr_00)) &&
     (iVar1 = msr_sys_read(ctx->sys,(uint64_t *)&state,zone_local,local_20,msr_00), iVar1 == 0)) {
    dVar2 = msr_get_energy_counter(&ctx->ctx,(uint64_t)state,msrval._4_4_);
    return dVar2;
  }
  return -1.0;
}

Assistant:

double raplcap_pd_get_energy_counter(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_ENERGY);
  raplcap_log(DEBUG, "raplcap_pd_get_energy_counter: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  return msr_get_energy_counter(&state->ctx, msrval, zone);
}